

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  Mem *pVal;
  double dVar5;
  int iVar6;
  byte *pbVar7;
  size_t sVar8;
  sqlite3_int64 sVar9;
  sqlite3_int64 sVar10;
  int iVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  DateTime *pDVar17;
  byte *pbVar18;
  char *zDate;
  undefined4 uVar19;
  undefined4 uVar20;
  int M;
  int Y;
  double r;
  int local_b4;
  DateTime *local_b0;
  double local_a8;
  sqlite3_context *local_a0;
  sqlite3_value **local_98;
  int local_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  double local_78;
  ulong local_70;
  DateTime local_68;
  
  p->s = 0.0;
  p->validJD = '\0';
  p->rawS = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validTZ = '\0';
  p->tzSet = '\0';
  p->isError = '\0';
  p->field_0x2f = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc == 0) {
    iVar6 = setDateTimeToCurrent(context,p);
    return iVar6;
  }
  pVal = *argv;
  local_a0 = context;
  local_98 = argv;
  if (1 < "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
          [pVal->flags & 0x3f] - 1) {
    pcVar12 = (char *)sqlite3ValueText(pVal,'\x01');
    if (pcVar12 == (char *)0x0) {
      return 1;
    }
    cVar1 = *pcVar12;
    uVar15 = (ulong)(cVar1 == '-');
    iVar6 = getDigits(pcVar12 + uVar15,"40f-21a-21d",&local_a8,&local_b4,&local_8c);
    if (iVar6 == 3) {
      zDate = pcVar12 + uVar15 + 9;
      do {
        do {
          pbVar7 = (byte *)(zDate + 1);
          zDate = zDate + 1;
        } while ((ulong)*pbVar7 == 0x54);
      } while ((""[*pbVar7] & 1) != 0);
      iVar6 = parseHhMmSs(zDate,p);
      argv = local_98;
      if (iVar6 != 0) {
        if (*zDate != '\0') goto LAB_001c13c1;
        p->validHMS = '\0';
      }
      p->validJD = '\0';
      p->validYMD = '\x01';
      iVar6 = -local_a8._0_4_;
      if (cVar1 != '-') {
        iVar6 = local_a8._0_4_;
      }
      p->Y = iVar6;
      p->M = local_b4;
      p->D = local_8c;
      if (p->validTZ != '\0') {
        computeJD(p);
        argv = local_98;
      }
    }
    else {
LAB_001c13c1:
      iVar6 = parseHhMmSs(pcVar12,p);
      if (iVar6 != 0) {
        lVar13 = 0;
        do {
          bVar2 = pcVar12[lVar13];
          bVar3 = "now"[lVar13];
          if (bVar2 == bVar3) {
            if ((ulong)bVar2 == 0) goto LAB_001c140f;
          }
          else if (""[bVar2] != ""[bVar3]) goto LAB_001c140f;
          lVar13 = lVar13 + 1;
        } while( true );
      }
    }
    goto LAB_001c14b1;
  }
  dVar5 = sqlite3VdbeRealValue(pVal);
  uVar19 = SUB84(dVar5,0);
  uVar20 = (undefined4)((ulong)dVar5 >> 0x20);
LAB_001c12c8:
  p->s = (double)CONCAT44(uVar20,uVar19);
  p->rawS = '\x01';
  if ((0.0 <= (double)CONCAT44(uVar20,uVar19)) &&
     ((double)CONCAT44(uVar20,uVar19) <= 5373484.5 && (double)CONCAT44(uVar20,uVar19) != 5373484.5))
  {
    p->iJD = (long)((double)CONCAT44(uVar20,uVar19) * 86400000.0 + 0.5);
    p->validJD = '\x01';
  }
LAB_001c14b1:
  local_b0 = p;
  if (argc < 2) {
LAB_001c1d88:
    pDVar17 = local_b0;
    computeJD(local_b0);
    uVar16 = 1;
    if (pDVar17->isError == '\0') {
      uVar16 = (uint)(0x1a6401072fdff < (ulong)pDVar17->iJD);
    }
    return uVar16;
  }
  local_70 = (ulong)(uint)argc;
  uVar15 = 1;
LAB_001c14db:
  pbVar7 = (byte *)sqlite3ValueText(argv[uVar15],'\x01');
  sqlite3ValueBytes(argv[uVar15],'\x01');
  pDVar17 = local_b0;
  if (pbVar7 == (byte *)0x0) {
    return 1;
  }
  local_b4 = 1;
  bVar2 = *pbVar7;
  bVar3 = ""[bVar2];
  if (bVar3 < 0x6c) {
    if (((9 < bVar3 - 0x30) && (bVar3 != 0x2b)) && (bVar3 != 0x2d)) goto LAB_001c17a8;
    lVar13 = 1;
    pbVar18 = pbVar7;
    while( true ) {
      bVar3 = pbVar7[lVar13];
      if (((bVar3 == 0) || (bVar3 == 0x3a)) || ((""[bVar3] & 1) != 0)) break;
      lVar13 = lVar13 + 1;
      pbVar18 = pbVar18 + 1;
    }
    iVar6 = sqlite3AtoF((char *)pbVar7,&local_a8,(int)lVar13,'\x01');
    if (iVar6 < 1) {
      local_b4 = 1;
      argv = local_98;
      goto LAB_001c17a8;
    }
    if (bVar3 != 0x3a) {
      do {
        pbVar7 = pbVar18 + 1;
        pbVar18 = pbVar18 + 1;
      } while ((""[*pbVar7] & 1) != 0);
      sVar8 = strlen((char *)pbVar18);
      argv = local_98;
      uVar16 = (uint)sVar8 & 0x3fffffff;
      if (0xfffffff7 < uVar16 - 0xb) {
        if ((pbVar18[uVar16 - 1] & 0xdf) == 0x53) {
          uVar16 = uVar16 - 1;
        }
        computeJD(local_b0);
        local_b4 = 1;
        local_88 = SUB84(local_a8,0);
        uStack_84 = (undefined4)((ulong)local_a8 >> 0x20);
        uStack_80 = 0;
        local_78 = *(double *)(&DAT_001e5230 + (ulong)(local_a8 < 0.0) * 8);
        lVar13 = 0;
        do {
          if (((uVar16 == (&aXformType[0].nName)[lVar13]) &&
              (iVar6 = sqlite3_strnicmp(*(char **)((long)&aXformType[0].zName + lVar13),
                                        (char *)pbVar18,uVar16), pDVar17 = local_b0, iVar6 == 0)) &&
             ((dVar5 = *(double *)((long)&aXformType[0].rLimit + lVar13),
              -dVar5 < (double)CONCAT44(uStack_84,local_88) &&
              ((double)CONCAT44(uStack_84,local_88) <= dVar5 &&
               dVar5 != (double)CONCAT44(uStack_84,local_88))))) {
            if ((&aXformType[0].eType)[lVar13] == '\x02') {
              dVar5 = (double)CONCAT44(uStack_84,local_88);
              computeYMD(local_b0);
              computeHMS(pDVar17);
              pDVar17->Y = pDVar17->Y + (int)dVar5;
              pDVar17->validJD = '\0';
              iVar6 = (int)(double)CONCAT44(uStack_84,local_88);
              argv = local_98;
LAB_001c1d47:
              local_a8 = (double)CONCAT44(uStack_84,local_88) - (double)iVar6;
            }
            else if ((&aXformType[0].eType)[lVar13] == '\x01') {
              computeYMD(local_b0);
              computeHMS(pDVar17);
              iVar6 = (int)(double)CONCAT44(uStack_84,local_88);
              iVar4 = pDVar17->M;
              iVar11 = iVar4 + iVar6;
              pDVar17->M = iVar11;
              if (iVar11 == 0 || SCARRY4(iVar4,iVar6) != iVar11 < 0) {
                uVar16 = (iVar11 + -0xc) / 0xc;
              }
              else {
                uVar16 = (iVar11 - 1U) / 0xc;
              }
              local_b0->Y = local_b0->Y + uVar16;
              local_b0->M = iVar11 + uVar16 * -0xc;
              local_b0->validJD = '\0';
              pDVar17 = local_b0;
              goto LAB_001c1d47;
            }
            computeJD(pDVar17);
            pDVar17->iJD = pDVar17->iJD +
                           (long)(local_a8 * *(double *)((long)&aXformType[0].rXform + lVar13) +
                                 local_78);
            local_b4 = 0;
            break;
          }
          lVar13 = lVar13 + 0x20;
        } while (lVar13 != 0xc0);
        local_b0->validYMD = '\0';
        local_b0->validHMS = '\0';
        local_b0->validTZ = '\0';
      }
      goto LAB_001c17a8;
    }
    local_68.s = 0.0;
    local_68.validJD = '\0';
    local_68.rawS = '\0';
    local_68.validYMD = '\0';
    local_68.validHMS = '\0';
    local_68.validTZ = '\0';
    local_68.tzSet = '\0';
    local_68.isError = '\0';
    local_68._47_1_ = 0;
    local_68.D = 0;
    local_68.h = 0;
    local_68.m = 0;
    local_68.tz = 0;
    local_68.iJD = 0;
    local_68.Y = 0;
    local_68.M = 0;
    iVar6 = parseHhMmSs((char *)(pbVar7 + ((ulong)bVar2 - 0x3a < 0xfffffffffffffff6)),&local_68);
    argv = local_98;
    if (iVar6 != 0) goto LAB_001c17a8;
    computeJD(&local_68);
    pDVar17 = local_b0;
    local_68.iJD = (local_68.iJD + -43200000) % 86400000;
    if (*pbVar7 == 0x2d) {
      local_68.iJD = -local_68.iJD;
    }
    computeJD(local_b0);
    pDVar17->validYMD = '\0';
    pDVar17->validHMS = '\0';
    pDVar17->validTZ = '\0';
    pDVar17->iJD = pDVar17->iJD + local_68.iJD;
    goto LAB_001c1629;
  }
  if (bVar3 < 0x75) {
    if (bVar3 == 0x6c) {
      lVar13 = 0;
      do {
        bVar2 = pbVar7[lVar13];
        bVar3 = "localtime"[lVar13];
        if (bVar2 == bVar3) {
          if ((ulong)bVar2 == 0) goto LAB_001c189e;
        }
        else if (""[bVar2] != ""[bVar3]) goto LAB_001c189e;
        lVar13 = lVar13 + 1;
      } while( true );
    }
    if (bVar3 == 0x73) {
      pbVar18 = pbVar7 + 9;
      lVar13 = 9;
      pcVar12 = "start of ";
      lVar14 = 0;
      do {
        if ((ulong)*pbVar7 == 0) {
          pcVar12 = "start of " + lVar14;
          goto LAB_001c1b3e;
        }
        if (""[*pbVar7] != ""[(byte)*pcVar12]) goto LAB_001c1b3e;
        pbVar7 = pbVar7 + 1;
        lVar14 = lVar14 + 1;
        pcVar12 = (char *)((byte *)pcVar12 + 1);
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      lVar13 = 0;
      pcVar12 = "";
      pbVar7 = pbVar18;
LAB_001c1b3e:
      if ((((int)lVar13 < 1) || (""[*pbVar7] == ""[(byte)*pcVar12])) &&
         ((local_b0->validJD != '\0' ||
          ((local_b0->validYMD != '\0' || (local_b0->validHMS != '\0')))))) {
        computeYMD(local_b0);
        pDVar17->validHMS = '\x01';
        pDVar17->validTZ = '\0';
        pDVar17->h = 0;
        pDVar17->m = 0;
        pDVar17->s = 0.0;
        pDVar17->validJD = '\0';
        pDVar17->rawS = '\0';
        lVar13 = 0;
        do {
          bVar2 = pbVar18[lVar13];
          bVar3 = "month"[lVar13];
          if (bVar2 == bVar3) {
            if ((ulong)bVar2 == 0) goto LAB_001c1bd5;
          }
          else if (""[bVar2] != ""[bVar3]) goto LAB_001c1bd5;
          lVar13 = lVar13 + 1;
        } while( true );
      }
    }
  }
  else if (bVar3 == 0x77) {
    pbVar18 = pbVar7 + 8;
    lVar13 = 8;
    pcVar12 = "weekday ";
    lVar14 = 0;
    do {
      if ((ulong)*pbVar7 == 0) {
        pcVar12 = "weekday " + lVar14;
        goto LAB_001c1a03;
      }
      if (""[*pbVar7] != ""[(byte)*pcVar12]) goto LAB_001c1a03;
      pbVar7 = pbVar7 + 1;
      lVar14 = lVar14 + 1;
      pcVar12 = (char *)((byte *)pcVar12 + 1);
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
    lVar13 = 0;
    pcVar12 = "";
    pbVar7 = pbVar18;
LAB_001c1a03:
    if (((int)lVar13 < 1) || (""[*pbVar7] == ""[(byte)*pcVar12])) {
      sVar8 = strlen((char *)pbVar18);
      iVar6 = sqlite3AtoF((char *)pbVar18,&local_a8,(uint)sVar8 & 0x3fffffff,'\x01');
      pDVar17 = local_b0;
      if ((0 < iVar6) && ((local_a8 < 7.0 && (uVar16 = (uint)local_a8, -1 < (int)uVar16)))) {
        if ((local_a8 == (double)(int)local_a8) && (!NAN(local_a8) && !NAN((double)(int)local_a8)))
        {
          computeYMD(local_b0);
          computeHMS(pDVar17);
          pDVar17->validTZ = '\0';
          pDVar17->validJD = '\0';
          computeJD(pDVar17);
          lVar13 = (pDVar17->iJD + 0x7b98a00) / 86400000;
          lVar14 = (lVar13 / 7) * -7 + -7 + lVar13;
          if (lVar13 % 7 <= (long)(ulong)uVar16) {
            lVar14 = lVar13 % 7;
          }
          pDVar17->iJD = ((ulong)uVar16 - lVar14) * 86400000 + pDVar17->iJD;
          pDVar17->validYMD = '\0';
          pDVar17->validHMS = '\0';
          pDVar17->validTZ = '\0';
          argv = local_98;
          goto LAB_001c1629;
        }
      }
    }
  }
  else if (bVar3 == 0x75) {
    lVar13 = 0;
    do {
      bVar2 = pbVar7[lVar13];
      bVar3 = "unixepoch"[lVar13];
      if (bVar2 == bVar3) {
        if ((ulong)bVar2 == 0) goto LAB_001c18e9;
      }
      else if (""[bVar2] != ""[bVar3]) goto LAB_001c18e9;
      lVar13 = lVar13 + 1;
    } while( true );
  }
  goto LAB_001c17a8;
LAB_001c140f:
  if ((bVar2 == bVar3) && (iVar6 = sqlite3NotPureFunc(local_a0), iVar6 != 0)) {
    iVar6 = setDateTimeToCurrent(local_a0,p);
    if (iVar6 != 0) {
      return 1;
    }
    goto LAB_001c14b1;
  }
  sVar8 = strlen(pcVar12);
  iVar6 = sqlite3AtoF(pcVar12,(double *)&local_68,(uint)sVar8 & 0x3fffffff,'\x01');
  if (iVar6 < 1) {
    return 1;
  }
  uVar19 = (undefined4)local_68.iJD;
  uVar20 = (undefined4)((ulong)local_68.iJD >> 0x20);
  goto LAB_001c12c8;
LAB_001c18e9:
  if ((bVar2 != bVar3) || (local_b0->rawS == '\0')) {
    lVar13 = 0;
    do {
      bVar2 = pbVar7[lVar13];
      bVar3 = "utc"[lVar13];
      if (bVar2 == bVar3) {
        if ((ulong)bVar2 == 0) goto LAB_001c197b;
      }
      else if (""[bVar2] != ""[bVar3]) goto LAB_001c197b;
      lVar13 = lVar13 + 1;
    } while( true );
  }
  local_a8 = local_b0->s * 1000.0 + 210866760000000.0;
  if ((local_a8 < 0.0) || (464269060800000.0 <= local_a8)) goto LAB_001c17a8;
  local_b0->validTZ = '\0';
  local_b0->iJD = (long)local_a8;
  pDVar17->validJD = '\x01';
  pDVar17->rawS = '\0';
  pDVar17->validYMD = '\0';
  pDVar17->validHMS = '\0';
  goto LAB_001c1629;
LAB_001c197b:
  if ((bVar2 != bVar3) || (iVar6 = sqlite3NotPureFunc(local_a0), pDVar17 = local_b0, iVar6 == 0))
  goto LAB_001c17a8;
  if (local_b0->tzSet == '\0') {
    computeJD(local_b0);
    sVar9 = localtimeOffset(pDVar17,local_a0,&local_b4);
    if (local_b4 == 0) {
      pDVar17->iJD = pDVar17->iJD - sVar9;
      pDVar17->validYMD = '\0';
      pDVar17->validHMS = '\0';
      pDVar17->validTZ = '\0';
      sVar10 = localtimeOffset(pDVar17,local_a0,&local_b4);
      pDVar17->iJD = pDVar17->iJD + (sVar9 - sVar10);
    }
    pDVar17->tzSet = '\x01';
    goto LAB_001c17a8;
  }
  goto LAB_001c1629;
LAB_001c189e:
  if ((bVar2 == bVar3) && (iVar6 = sqlite3NotPureFunc(local_a0), pDVar17 = local_b0, iVar6 != 0)) {
    computeJD(local_b0);
    sVar9 = localtimeOffset(pDVar17,local_a0,&local_b4);
    pDVar17->iJD = pDVar17->iJD + sVar9;
    pDVar17->validYMD = '\0';
    pDVar17->validHMS = '\0';
    pDVar17->validTZ = '\0';
  }
  goto LAB_001c17a8;
LAB_001c1bd5:
  if (bVar2 != bVar3) {
    lVar13 = 0;
    do {
      bVar2 = pbVar18[lVar13];
      bVar3 = "year"[lVar13];
      if (bVar2 == bVar3) {
        if ((ulong)bVar2 == 0) goto LAB_001c1c18;
      }
      else if (""[bVar2] != ""[bVar3]) goto LAB_001c1c18;
      lVar13 = lVar13 + 1;
    } while( true );
  }
  local_b0->D = 1;
  goto LAB_001c1629;
LAB_001c1c18:
  if (bVar2 != bVar3) {
    lVar13 = 0;
    do {
      bVar2 = pbVar18[lVar13];
      bVar3 = "julianday"[lVar13 + 6];
      if (bVar2 == bVar3) {
        if ((ulong)bVar2 == 0) goto LAB_001c1cba;
      }
      else if (""[bVar2] != ""[bVar3]) goto LAB_001c1cba;
      lVar13 = lVar13 + 1;
    } while( true );
  }
  local_b0->M = 1;
  local_b0->D = 1;
LAB_001c1629:
  local_b4 = 0;
LAB_001c17a8:
  if (local_b4 != 0) {
    return 1;
  }
  uVar15 = uVar15 + 1;
  if (uVar15 == local_70) goto LAB_001c1d88;
  goto LAB_001c14db;
LAB_001c1cba:
  if (bVar2 != bVar3) goto LAB_001c17a8;
  goto LAB_001c1629;
}

Assistant:

static int isDate(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv, 
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  return 0;
}